

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdFloat32x4OperationX86X64.cpp
# Opt level: O3

SIMDValue Js::SIMDFloat32x4Operation::OpReciprocal(SIMDValue *value)

{
  anon_union_16_9_4d7543c8_for__SIMDValue_0 aVar1;
  
  aVar1.i32 = (Type  [4])divps(_DAT_0111d510,value->field_0);
  return (SIMDValue)aVar1;
}

Assistant:

SIMDValue SIMDFloat32x4Operation::OpReciprocal(const SIMDValue& value)
    {
        X86SIMDValue x86Result;
        X86SIMDValue v = X86SIMDValue::ToX86SIMDValue(value);

        // RCPPS is not precise. Using DIVPS
        // Divides the four single-precision, floating-point values of 1.0 and value
        x86Result.m128_value = _mm_div_ps(X86_ALL_ONES_F4.m128_value, v.m128_value); // result = 1.0/value

        return X86SIMDValue::ToSIMDValue(x86Result);
    }